

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

bool __thiscall rw::MaterialList::streamWrite(MaterialList *this,Stream *stream)

{
  Material **ppMVar1;
  long lVar2;
  uint32 size;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  size = streamGetSize(this);
  writeChunkHeader(stream,8,size);
  writeChunkHeader(stream,1,this->numMaterials * 4 + 4);
  Stream::writeI32(stream,this->numMaterials);
  if (0 < this->numMaterials) {
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      do {
        if ((long)uVar4 < 1) {
          uVar4 = 0xffffffff;
          break;
        }
        uVar4 = uVar4 - 1;
      } while (this->materials[uVar5] != this->materials[uVar4 & 0xffffffff]);
      Stream::writeI32(stream,(int32)uVar4);
      uVar5 = uVar5 + 1;
      uVar4 = (ulong)this->numMaterials;
    } while ((long)uVar5 < (long)uVar4);
    if (0 < this->numMaterials) {
      lVar6 = 0;
      do {
        ppMVar1 = this->materials;
        lVar3 = lVar6;
        do {
          if (lVar3 < 1) {
            Material::streamWrite(ppMVar1[lVar6],stream);
            uVar4 = (ulong)(uint)this->numMaterials;
            break;
          }
          lVar2 = lVar3 + -1;
          lVar3 = lVar3 + -1;
        } while (ppMVar1[lVar6] != ppMVar1[lVar2]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < (int)uVar4);
    }
  }
  return true;
}

Assistant:

bool
MaterialList::streamWrite(Stream *stream)
{
	uint32 size = this->streamGetSize();
	writeChunkHeader(stream, ID_MATLIST, size);
	writeChunkHeader(stream, ID_STRUCT, 4 + this->numMaterials*4);
	stream->writeI32(this->numMaterials);

	int32 idx;
	for(int32 i = 0; i < this->numMaterials; i++){
		idx = -1;
		for(int32 j = i-1; j >= 0; j--)
			if(this->materials[i] == this->materials[j]){
				idx = j;
				break;
			}
		stream->writeI32(idx);
	}
	for(int32 i = 0; i < this->numMaterials; i++){
		for(int32 j = i-1; j >= 0; j--)
			if(this->materials[i] == this->materials[j])
				goto found;
		this->materials[i]->streamWrite(stream);
		found:;
	}
	return true;
}